

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_medium.c
# Opt level: O1

block_state deflate_medium(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  short sVar3;
  ushort uVar4;
  Pos cur_match;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  uchar *puVar19;
  uchar *puVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  block_state bVar28;
  ulong uVar29;
  bool bVar30;
  uint local_50;
  
  iVar2 = s->level;
  uVar22 = 0;
  uVar26 = 0;
  uVar15 = 0;
  local_50 = 0;
  do {
    uVar29 = uVar15;
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        iVar23 = 1;
      }
      else {
        if (s->lookahead != 0) {
          uVar29 = 0;
          goto LAB_001050f5;
        }
        iVar23 = 2;
      }
    }
    else {
LAB_001050f5:
      if ((iVar2 < 5) ||
         (uVar8 = (uint)uVar22, uVar25 = uVar26, uVar24 = local_50, (short)uVar29 == 0)) {
        if (s->lookahead < 4) {
          uVar4 = 0;
        }
        else {
          uVar4 = quick_insert_string(s,s->strstart);
        }
        uVar8 = s->strstart;
        uVar25 = (ulong)uVar8;
        uVar24 = 0;
        uVar29 = 1;
        if (((uVar4 != 0) && (0 < (long)(uVar25 - uVar4))) &&
           ((long)(uVar25 - uVar4) <= (long)(ulong)(s->w_size - 0x106))) {
          uVar6 = longest_match_unaligned_16(s,uVar4);
          if ((uVar6 & 0xfffc) == 0) {
            uVar6 = 1;
          }
          uVar4 = (ushort)s->match_start;
          uVar24 = (uint)uVar4;
          if (uVar4 < (ushort)uVar8) {
            uVar29 = (ulong)uVar6;
          }
        }
      }
      uVar12 = (uint)uVar29;
      uVar27 = uVar29 & 0xffff;
      uVar6 = (uint)uVar27;
      if (uVar6 + 4 < s->lookahead) {
        uVar13 = uVar8 & 0xffff;
        uVar10 = (uint)uVar25 + 1;
        uVar7 = uVar6 - 1 & 0xffff;
        uVar16 = uVar10 & 0xffff;
        if (uVar7 < 3) {
          if ((uVar7 == 0) || ((ushort)uVar10 < (ushort)uVar8)) goto LAB_001051c1;
          uVar11 = uVar7 + (uVar10 & 0xffff);
LAB_00105427:
          if (uVar11 <= uVar13) {
            uVar7 = (uVar13 - (uVar10 & 0xffff)) + 1;
          }
        }
        else {
          uVar11 = uVar7 + (uVar10 & 0xffff);
          if ((ushort)uVar8 <= (ushort)uVar10) goto LAB_00105427;
          uVar7 = uVar11 - uVar13;
          uVar16 = uVar13;
          if (uVar11 < uVar13 || uVar7 == 0) goto LAB_001051c1;
        }
        insert_string(s,uVar16,uVar7);
      }
LAB_001051c1:
      uVar8 = (uint)uVar25 & 0xffff;
      if (((iVar2 < 5) || (s->lookahead < 0x107)) ||
         (uVar17 = uVar8 + uVar6, s->window_size - 0x106 <= uVar17)) {
        uVar15 = 0;
      }
      else {
        s->strstart = uVar17;
        cur_match = quick_insert_string(s,uVar17);
        uVar16 = s->strstart;
        uVar22 = (ulong)uVar16;
        local_50 = 0;
        uVar15 = 1;
        if (((cur_match == 0) || ((long)(uVar22 - cur_match) < 1)) ||
           ((long)(ulong)(s->w_size - 0x106) < (long)(uVar22 - cur_match))) {
          uVar26 = (ulong)uVar16;
          uVar7 = local_50;
        }
        else {
          uVar17 = longest_match_unaligned_16(s,cur_match);
          uVar9 = (ulong)uVar17;
          uVar7 = s->match_start;
          uVar4 = (ushort)uVar7;
          uVar18 = (ulong)uVar4;
          uVar10 = uVar16 & 0xffff;
          if (uVar10 <= (uVar7 & 0xffff)) {
            uVar9 = 1;
          }
          uVar5 = (ushort)uVar9;
          uVar26 = uVar22;
          if (((3 < uVar5) && (uVar15 = uVar9, 1 < (ushort)uVar29)) &&
             ((uVar6 <= (uVar7 & 0xffff) + 1 && (uVar6 <= uVar10 + 1)))) {
            puVar19 = s->window;
            uVar21 = uVar22 & 0xffff;
            if (puVar19[(uVar18 + 1) - uVar27] == puVar19[(uVar21 + 1) - uVar27]) {
              uVar13 = s->w_size - 0x106;
              uVar6 = uVar16 - uVar13 & 0xffff;
              if (uVar10 <= uVar13) {
                uVar6 = 0;
              }
              bVar30 = uVar6 < uVar10;
              uVar27 = uVar22;
              uVar13 = uVar12;
              local_50 = uVar7;
              if ((1 < uVar4 && uVar5 < 0x100) &&
                  (bVar30 && puVar19[uVar18 - 1] == puVar19[uVar21 - 1])) {
                puVar20 = puVar19 + -2;
                uVar27 = uVar9;
                iVar23 = 0;
                do {
                  uVar10 = uVar10 - 1;
                  uVar13 = (int)uVar27 + 1;
                  uVar9 = (ulong)uVar13;
                  iVar14 = iVar23 + -1;
                  if (((puVar20[uVar18] != puVar20[uVar21]) ||
                      (sVar3 = (short)iVar23, (ushort)(sVar3 + (ushort)uVar29) == 1)) ||
                     ((uVar10 <= uVar6 || (0xfe < (ushort)uVar27)))) break;
                  puVar20 = puVar20 + -1;
                  uVar27 = (ulong)uVar13;
                  iVar23 = iVar14;
                } while (1 < (ushort)((sVar3 + uVar4) - 1));
                uVar27 = (ulong)(uVar16 + iVar14);
                local_50 = uVar7 + iVar14;
                uVar13 = iVar14 + uVar12;
              }
              if ((((1 < uVar4 && uVar5 < 0x100) &&
                    (bVar30 && puVar19[uVar18 - 1] == puVar19[uVar21 - 1])) && ((ushort)uVar13 < 2))
                 && ((short)uVar9 != 2)) {
                uVar22 = (ulong)(uVar16 + 1);
                uVar15 = uVar9;
                uVar26 = uVar27;
                uVar12 = uVar13;
                uVar7 = local_50;
              }
            }
          }
        }
        local_50 = uVar7;
        s->strstart = uVar8;
        uVar29 = (ulong)uVar12;
      }
      uVar4 = (ushort)uVar29;
      uVar6 = (uint)uVar29 & 0xffff;
      if (uVar4 < 4) {
        uVar8 = 0;
        while (uVar4 != 0) {
          bVar1 = s->window[uVar25 & 0xffff];
          uVar24 = s->sym_next;
          s->d_buf[uVar24] = 0;
          s->sym_next = uVar24 + 1;
          s->l_buf[uVar24] = bVar1;
          s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
          s->lookahead = s->lookahead - 1;
          uVar8 = uVar8 + (s->sym_next == s->sym_end);
          uVar25 = (ulong)((int)uVar25 + 1);
          uVar4 = (short)uVar29 - 1;
          uVar29 = (ulong)uVar4;
        }
      }
      else {
        iVar23 = uVar8 - (uVar24 & 0xffff);
        uVar8 = s->sym_next;
        s->d_buf[uVar8] = (uint16_t)iVar23;
        s->sym_next = uVar8 + 1;
        s->l_buf[uVar8] = (uchar)(uVar6 - 3);
        s->matches = s->matches + 1;
        s->dyn_ltree[(ulong)""[uVar6 - 3] + 0x101].fc.freq =
             s->dyn_ltree[(ulong)""[uVar6 - 3] + 0x101].fc.freq + 1;
        uVar24 = iVar23 - 1;
        uVar8 = (uVar24 >> 7) + 0x100;
        if (uVar24 < 0x100) {
          uVar8 = uVar24;
        }
        s->dyn_dtree[""[uVar8]].fc.freq = s->dyn_dtree[""[uVar8]].fc.freq + 1;
        uVar8 = (uint)(s->sym_next == s->sym_end);
        s->lookahead = s->lookahead - uVar6;
      }
      uVar6 = uVar6 + s->strstart;
      s->strstart = uVar6;
      if (uVar8 != 0) {
        iVar23 = s->block_start;
        if ((long)iVar23 < 0) {
          puVar19 = (uchar *)0x0;
        }
        else {
          puVar19 = s->window + iVar23;
        }
        zng_tr_flush_block(s,(char *)puVar19,uVar6 - iVar23,0);
        s->block_start = s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out == 0) {
          iVar23 = 1;
          goto LAB_001053d4;
        }
      }
      iVar23 = 0;
    }
LAB_001053d4:
    if (iVar23 != 0) {
      if (iVar23 == 2) {
        uVar8 = s->strstart;
        uVar24 = 2;
        if (uVar8 < 2) {
          uVar24 = uVar8;
        }
        s->insert = uVar24;
        if (flush == 4) {
          iVar2 = s->block_start;
          if ((long)iVar2 < 0) {
            puVar19 = (uchar *)0x0;
          }
          else {
            puVar19 = s->window + iVar2;
          }
          zng_tr_flush_block(s,(char *)puVar19,uVar8 - iVar2,1);
          s->block_start = s->strstart;
          flush_pending(s->strm);
          bVar28 = finish_done - (s->strm->avail_out == 0);
        }
        else {
          if (s->sym_next != 0) {
            iVar2 = s->block_start;
            if ((long)iVar2 < 0) {
              puVar19 = (uchar *)0x0;
            }
            else {
              puVar19 = s->window + iVar2;
            }
            zng_tr_flush_block(s,(char *)puVar19,uVar8 - iVar2,0);
            s->block_start = s->strstart;
            flush_pending(s->strm);
            if (s->strm->avail_out == 0) {
              return need_more;
            }
          }
          bVar28 = block_done;
        }
      }
      else {
        bVar28 = need_more;
      }
      return bVar28;
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_medium(deflate_state *s, int flush) {
    /* Align the first struct to start on a new cacheline, this allows us to fit both structs in one cacheline */
    ALIGNED_(16) struct match current_match;
                 struct match next_match;

    /* For levels below 5, don't check the next position for a better match */
    int early_exit = s->level < 5;

    memset(&current_match, 0, sizeof(struct match));
    memset(&next_match, 0, sizeof(struct match));

    for (;;) {
        Pos hash_head = 0;    /* head of the hash chain */
        int bflush = 0;       /* set if current block must be flushed */
        int64_t dist;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next current_match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
            next_match.match_length = 0;
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */

        /* If we already have a future match from a previous round, just use that */
        if (!early_exit && next_match.match_length > 0) {
            current_match = next_match;
            next_match.match_length = 0;
        } else {
            hash_head = 0;
            if (s->lookahead >= WANT_MIN_MATCH) {
                hash_head = quick_insert_string(s, s->strstart);
            }

            current_match.strstart = (uint16_t)s->strstart;
            current_match.orgstart = current_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                current_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                current_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(current_match.match_length < WANT_MIN_MATCH))
                    current_match.match_length = 1;
                if (UNLIKELY(current_match.match_start >= current_match.strstart)) {
                    /* this can happen due to some restarts */
                    current_match.match_length = 1;
                }
            } else {
                /* Set up the match to be a 1 byte literal */
                current_match.match_start = 0;
                current_match.match_length = 1;
            }
        }

        insert_match(s, current_match);

        /* now, look ahead one */
        if (LIKELY(!early_exit && s->lookahead > MIN_LOOKAHEAD && (uint32_t)(current_match.strstart + current_match.match_length) < (s->window_size - MIN_LOOKAHEAD))) {
            s->strstart = current_match.strstart + current_match.match_length;
            hash_head = quick_insert_string(s, s->strstart);

            next_match.strstart = (uint16_t)s->strstart;
            next_match.orgstart = next_match.strstart;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match_length < WANT_MIN_MATCH
             */

            dist = (int64_t)s->strstart - hash_head;
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                next_match.match_length = (uint16_t)FUNCTABLE_CALL(longest_match)(s, hash_head);
                next_match.match_start = (uint16_t)s->match_start;
                if (UNLIKELY(next_match.match_start >= next_match.strstart)) {
                    /* this can happen due to some restarts */
                    next_match.match_length = 1;
                }
                if (next_match.match_length < WANT_MIN_MATCH)
                    next_match.match_length = 1;
                else
                    fizzle_matches(s, &current_match, &next_match);
            } else {
                /* Set up the match to be a 1 byte literal */
                next_match.match_start = 0;
                next_match.match_length = 1;
            }

            s->strstart = current_match.strstart;
        } else {
            next_match.match_length = 0;
        }

        /* now emit the current match */
        bflush = emit_match(s, current_match);

        /* move the "cursor" forward */
        s->strstart += current_match.match_length;

        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);

    return block_done;
}